

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_update(Terminal *term)

{
  uint start_00;
  _Bool _Var1;
  byte local_1a;
  byte local_19;
  _Bool need_sbar_update;
  uint ncolours;
  uint start;
  Terminal *term_local;
  
  term->window_update_pending = false;
  if ((term->win_move_pending & 1U) != 0) {
    win_move(term->win,term->win_move_pending_x,term->win_move_pending_y);
    term->win_move_pending = false;
  }
  if (term->win_resize_pending == ABOUT_TO) {
    term->win_resize_pending = DRAGGING;
    win_request_resize(term->win,term->win_resize_pending_w,term->win_resize_pending_h);
  }
  if ((term->win_zorder_pending & 1U) != 0) {
    win_set_zorder(term->win,(_Bool)(term->win_zorder_top & 1));
    term->win_zorder_pending = false;
  }
  if ((term->win_minimise_pending & 1U) != 0) {
    win_set_minimised(term->win,(_Bool)(term->win_minimise_enable & 1));
    term->win_minimise_pending = false;
  }
  if ((term->win_maximise_pending & 1U) != 0) {
    win_set_maximised(term->win,(_Bool)(term->win_maximise_enable & 1));
    term->win_maximise_pending = false;
  }
  if ((term->win_title_pending & 1U) != 0) {
    win_set_title(term->win,term->window_title,term->wintitle_codepage);
    term->win_title_pending = false;
  }
  if ((term->win_icon_title_pending & 1U) != 0) {
    win_set_icon_title(term->win,term->icon_title,term->icontitle_codepage);
    term->win_icon_title_pending = false;
  }
  if ((term->win_pointer_shape_pending & 1U) != 0) {
    win_set_raw_mouse_mode_pointer(term->win,(_Bool)(term->win_pointer_shape_raw & 1));
    term->win_pointer_shape_pending = false;
  }
  if ((term->win_refresh_pending & 1U) != 0) {
    win_refresh(term->win);
    term->win_refresh_pending = false;
  }
  if ((term->win_palette_pending & 1U) != 0) {
    start_00 = term->win_palette_pending_min;
    win_palette_set(term->win,start_00,term->win_palette_pending_limit - start_00,
                    term->palette + start_00);
    term->win_palette_pending = false;
  }
  _Var1 = win_setup_draw_ctx(term->win);
  if (_Var1) {
    local_1a = 1;
    if ((term->seen_disp_event & 1U) == 0) {
      local_1a = term->win_scrollbar_update_pending;
    }
    local_19 = local_1a & 1;
    term->win_scrollbar_update_pending = false;
    if (((term->seen_disp_event & 1U) != 0) && ((term->scroll_on_disp & 1U) != 0)) {
      term->disptop = L'\0';
      term->seen_disp_event = false;
      local_19 = 1;
    }
    if (local_19 != 0) {
      update_sbar(term);
    }
    do_paint(term);
    win_set_cursor_pos(term->win,(term->curs).x,(term->curs).y - term->disptop);
    win_free_draw_ctx(term->win);
  }
  return;
}

Assistant:

void term_update(Terminal *term)
{
    term->window_update_pending = false;

    if (term->win_move_pending) {
        win_move(term->win, term->win_move_pending_x,
                 term->win_move_pending_y);
        term->win_move_pending = false;
    }
    if (term->win_resize_pending == WIN_RESIZE_NEED_SEND) {
        term->win_resize_pending = WIN_RESIZE_AWAIT_REPLY;
        win_request_resize(term->win, term->win_resize_pending_w,
                           term->win_resize_pending_h);
    }
    if (term->win_zorder_pending) {
        win_set_zorder(term->win, term->win_zorder_top);
        term->win_zorder_pending = false;
    }
    if (term->win_minimise_pending) {
        win_set_minimised(term->win, term->win_minimise_enable);
        term->win_minimise_pending = false;
    }
    if (term->win_maximise_pending) {
        win_set_maximised(term->win, term->win_maximise_enable);
        term->win_maximise_pending = false;
    }
    if (term->win_title_pending) {
        win_set_title(term->win, term->window_title,
                      term->wintitle_codepage);
        term->win_title_pending = false;
    }
    if (term->win_icon_title_pending) {
        win_set_icon_title(term->win, term->icon_title,
                           term->icontitle_codepage);
        term->win_icon_title_pending = false;
    }
    if (term->win_pointer_shape_pending) {
        win_set_raw_mouse_mode_pointer(term->win, term->win_pointer_shape_raw);
        term->win_pointer_shape_pending = false;
    }
    if (term->win_refresh_pending) {
        win_refresh(term->win);
        term->win_refresh_pending = false;
    }
    if (term->win_palette_pending) {
        unsigned start = term->win_palette_pending_min;
        unsigned ncolours = term->win_palette_pending_limit - start;
        win_palette_set(term->win, start, ncolours, term->palette + start);
        term->win_palette_pending = false;
    }

    if (win_setup_draw_ctx(term->win)) {
        bool need_sbar_update = term->seen_disp_event ||
            term->win_scrollbar_update_pending;
        term->win_scrollbar_update_pending = false;
        if (term->seen_disp_event && term->scroll_on_disp) {
            term->disptop = 0;         /* return to main screen */
            term->seen_disp_event = false;
            need_sbar_update = true;
        }

        if (need_sbar_update)
            update_sbar(term);
        do_paint(term);
        win_set_cursor_pos(
            term->win, term->curs.x, term->curs.y - term->disptop);
        win_free_draw_ctx(term->win);
    }
}